

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Flatten_x86::forward(Flatten_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  undefined4 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  Allocator *pAVar9;
  size_t sVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  int iVar26;
  long lVar27;
  void *pvVar28;
  long lVar29;
  void *pvVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  byte bVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  int iVar44;
  size_t sVar45;
  undefined4 *puVar46;
  undefined4 *puVar47;
  
  iVar26 = bottom_blob->elempack;
  uVar40 = (ulong)iVar26;
  if ((uVar40 != 0) && (((int)bottom_blob->elemsize << 3) / iVar26 == 8)) {
    iVar26 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar26;
  }
  uVar31 = bottom_blob->dims;
  if (uVar31 == 1) {
    iVar36 = 0;
    if (top_blob != bottom_blob) {
      piVar7 = bottom_blob->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      piVar7 = top_blob->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar7 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar7;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar26 = bottom_blob->w;
      iVar44 = bottom_blob->h;
      iVar43 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar26;
      top_blob->h = iVar44;
      top_blob->d = iVar43;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    uVar4 = bottom_blob->w;
    lVar41 = (long)(int)uVar4;
    uVar5 = bottom_blob->h;
    uVar6 = bottom_blob->c;
    uVar8 = bottom_blob->elemsize;
    uVar39 = uVar5 * uVar4 * bottom_blob->d;
    uVar34 = uVar6 * iVar26 * uVar39;
    bVar35 = (uVar34 & 3) == 0 & opt->use_packing_layout;
    sVar45 = uVar8 / uVar40 << bVar35 * '\x02';
    if (bVar35 == 0) {
      iVar26 = Flatten::forward((Flatten *)
                                ((long)&this->_vptr_Flatten_x86 + (long)this->_vptr_Flatten_x86[-3])
                                ,bottom_blob,top_blob,opt);
      return iVar26;
    }
    iVar36 = (uint)bVar35 + (uint)bVar35 * 2 + 1;
    if (iVar26 == 1 && (uVar31 ^ 2) == 0) {
      if (top_blob != bottom_blob) {
        piVar7 = bottom_blob->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + 1;
          UNLOCK();
        }
        piVar7 = top_blob->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pvVar28 = top_blob->data;
            pAVar9 = top_blob->allocator;
            if (pAVar9 == (Allocator *)0x0) {
              if (pvVar28 != (void *)0x0) {
                free(pvVar28);
              }
            }
            else {
              (*pAVar9->_vptr_Allocator[3])(pAVar9,pvVar28,uVar8 % uVar40);
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar7 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar7;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar26 = bottom_blob->w;
        iVar44 = bottom_blob->h;
        iVar43 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar26;
        top_blob->h = iVar44;
        top_blob->d = iVar43;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
      top_blob->dims = 1;
      top_blob->w = (int)uVar34 / iVar36;
      top_blob->h = 1;
      top_blob->cstep = (long)((int)uVar34 / iVar36);
      top_blob->elemsize = sVar45;
      top_blob->elempack = iVar36;
      iVar36 = 0;
    }
    else {
      Mat::create(top_blob,(int)uVar34 / iVar36,sVar45,iVar36,opt->blob_allocator);
      iVar36 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (0 < (int)uVar5 && (iVar26 == 4 && (uVar31 ^ 2) == 0)) {
          lVar29 = lVar41 * 4;
          lVar27 = lVar41 * 0x10;
          lVar37 = lVar41 * 8;
          lVar38 = lVar41 * 0xc;
          iVar36 = 0;
          uVar40 = 0;
          do {
            iVar44 = bottom_blob->w;
            pvVar28 = bottom_blob->data;
            sVar45 = bottom_blob->elemsize;
            puVar46 = (undefined4 *)(uVar40 * (long)iVar44 * sVar45 + (long)pvVar28);
            pvVar30 = top_blob->data;
            if ((int)uVar4 < 4) {
              lVar33 = (long)(int)(uVar4 * 4 * (int)uVar40) * 4;
              lVar1 = (uVar40 * 4 + 1) * lVar41 * 4;
              lVar2 = (uVar40 * 4 + 2) * lVar41 * 4;
              lVar42 = (uVar40 * 4 + 3) * lVar41 * 4;
              uVar34 = 0;
            }
            else {
              iVar43 = 3;
              lVar42 = 0;
              do {
                puVar47 = puVar46;
                puVar46 = (undefined4 *)
                          ((long)pvVar28 + lVar42 * 4 + sVar45 * uVar40 * (long)iVar44);
                uVar11 = puVar46[1];
                uVar12 = puVar46[2];
                uVar13 = puVar46[3];
                uVar14 = puVar46[4];
                uVar15 = puVar46[5];
                uVar16 = puVar46[6];
                uVar17 = puVar46[7];
                uVar18 = puVar46[8];
                uVar19 = puVar46[9];
                uVar20 = puVar46[10];
                uVar21 = puVar46[0xb];
                uVar22 = puVar46[0xc];
                uVar23 = puVar46[0xd];
                uVar24 = puVar46[0xe];
                uVar25 = puVar46[0xf];
                puVar3 = (undefined4 *)((long)pvVar30 + lVar42 + (long)iVar36 * 4);
                *puVar3 = *puVar46;
                puVar3[1] = uVar14;
                puVar3[2] = uVar18;
                puVar3[3] = uVar22;
                puVar3 = (undefined4 *)((long)pvVar30 + lVar42 + lVar29);
                *puVar3 = uVar11;
                puVar3[1] = uVar15;
                puVar3[2] = uVar19;
                puVar3[3] = uVar23;
                puVar3 = (undefined4 *)((long)pvVar30 + lVar42 + lVar37);
                *puVar3 = uVar12;
                puVar3[1] = uVar16;
                puVar3[2] = uVar20;
                puVar3[3] = uVar24;
                puVar3 = (undefined4 *)((long)pvVar30 + lVar42 + lVar38);
                *puVar3 = uVar13;
                puVar3[1] = uVar17;
                puVar3[2] = uVar21;
                puVar3[3] = uVar25;
                lVar42 = lVar42 + 0x10;
                iVar43 = iVar43 + 4;
                puVar46 = puVar46 + 0x10;
              } while (iVar43 < (int)uVar4);
              puVar46 = puVar47 + 0x10;
              lVar33 = lVar42 + (long)iVar36 * 4;
              lVar1 = lVar42 + lVar29;
              lVar2 = lVar42 + lVar37;
              lVar42 = lVar42 + lVar38;
              uVar34 = uVar4 & 0xfffffffc;
            }
            if ((int)uVar34 < (int)uVar4) {
              lVar32 = 0;
              do {
                *(undefined4 *)((long)pvVar30 + lVar32 * 4 + lVar33) = *puVar46;
                *(undefined4 *)((long)pvVar30 + lVar32 * 4 + lVar1) = puVar46[1];
                *(undefined4 *)((long)pvVar30 + lVar32 * 4 + lVar2) = puVar46[2];
                *(undefined4 *)((long)pvVar30 + lVar32 * 4 + lVar42) = puVar46[3];
                puVar46 = puVar46 + 4;
                lVar32 = lVar32 + 1;
              } while (uVar4 - uVar34 != (int)lVar32);
            }
            uVar40 = uVar40 + 1;
            iVar36 = iVar36 + uVar4 * 4;
            lVar29 = lVar29 + lVar27;
            lVar37 = lVar37 + lVar27;
            lVar38 = lVar38 + lVar27;
          } while (uVar40 != uVar5);
        }
        iVar36 = 0;
        if (uVar31 - 3 < 2) {
          lVar41 = (long)(int)uVar39;
          if (0 < (int)uVar6 && iVar26 == 4) {
            lVar29 = lVar41 * 4;
            lVar38 = lVar41 * 0xc;
            lVar27 = lVar41 * 0x10;
            lVar37 = lVar41 * 8;
            iVar36 = 0;
            uVar40 = 0;
            do {
              pvVar28 = bottom_blob->data;
              sVar45 = bottom_blob->elemsize;
              sVar10 = bottom_blob->cstep;
              puVar46 = (undefined4 *)(sVar10 * uVar40 * sVar45 + (long)pvVar28);
              pvVar30 = top_blob->data;
              if ((int)uVar39 < 4) {
                lVar33 = (long)(int)(uVar39 * 4 * (int)uVar40) * 4;
                lVar1 = (uVar40 * 4 + 1) * lVar41 * 4;
                lVar2 = (uVar40 * 4 + 2) * lVar41 * 4;
                lVar42 = (uVar40 * 4 + 3) * lVar41 * 4;
                uVar31 = 0;
              }
              else {
                iVar44 = 3;
                lVar33 = 0;
                do {
                  puVar47 = puVar46;
                  puVar46 = (undefined4 *)((long)pvVar28 + lVar33 * 4 + sVar10 * sVar45 * uVar40);
                  uVar11 = puVar46[1];
                  uVar12 = puVar46[2];
                  uVar13 = puVar46[3];
                  uVar14 = puVar46[4];
                  uVar15 = puVar46[5];
                  uVar16 = puVar46[6];
                  uVar17 = puVar46[7];
                  uVar18 = puVar46[8];
                  uVar19 = puVar46[9];
                  uVar20 = puVar46[10];
                  uVar21 = puVar46[0xb];
                  uVar22 = puVar46[0xc];
                  uVar23 = puVar46[0xd];
                  uVar24 = puVar46[0xe];
                  uVar25 = puVar46[0xf];
                  puVar3 = (undefined4 *)((long)pvVar30 + lVar33 + (long)iVar36 * 4);
                  *puVar3 = *puVar46;
                  puVar3[1] = uVar14;
                  puVar3[2] = uVar18;
                  puVar3[3] = uVar22;
                  puVar3 = (undefined4 *)((long)pvVar30 + lVar33 + lVar29);
                  *puVar3 = uVar11;
                  puVar3[1] = uVar15;
                  puVar3[2] = uVar19;
                  puVar3[3] = uVar23;
                  puVar3 = (undefined4 *)((long)pvVar30 + lVar33 + lVar37);
                  *puVar3 = uVar12;
                  puVar3[1] = uVar16;
                  puVar3[2] = uVar20;
                  puVar3[3] = uVar24;
                  puVar3 = (undefined4 *)((long)pvVar30 + lVar33 + lVar38);
                  *puVar3 = uVar13;
                  puVar3[1] = uVar17;
                  puVar3[2] = uVar21;
                  puVar3[3] = uVar25;
                  iVar44 = iVar44 + 4;
                  lVar33 = lVar33 + 0x10;
                  puVar46 = puVar46 + 0x10;
                } while (iVar44 < (int)uVar39);
                puVar46 = puVar47 + 0x10;
                lVar42 = lVar33 + lVar38;
                lVar2 = lVar33 + lVar37;
                lVar1 = lVar33 + lVar29;
                lVar33 = lVar33 + (long)iVar36 * 4;
                uVar31 = uVar39 & 0xfffffffc;
              }
              if (uVar39 - uVar31 != 0 && (int)uVar31 <= (int)uVar39) {
                lVar32 = 0;
                do {
                  *(undefined4 *)((long)pvVar30 + lVar32 * 4 + lVar33) = *puVar46;
                  *(undefined4 *)((long)pvVar30 + lVar32 * 4 + lVar1) = puVar46[1];
                  *(undefined4 *)((long)pvVar30 + lVar32 * 4 + lVar2) = puVar46[2];
                  *(undefined4 *)((long)pvVar30 + lVar32 * 4 + lVar42) = puVar46[3];
                  puVar46 = puVar46 + 4;
                  lVar32 = lVar32 + 1;
                } while (uVar39 - uVar31 != (int)lVar32);
              }
              uVar40 = uVar40 + 1;
              lVar38 = lVar38 + lVar27;
              lVar37 = lVar37 + lVar27;
              lVar29 = lVar29 + lVar27;
              iVar36 = iVar36 + uVar39 * 4;
            } while (uVar40 != uVar6);
          }
          iVar36 = 0;
          if (0 < (int)uVar6 && iVar26 == 1) {
            pvVar28 = bottom_blob->data;
            sVar45 = bottom_blob->cstep;
            sVar10 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            uVar40 = 0;
            iVar36 = 0;
            do {
              if (0 < (int)uVar39) {
                lVar29 = 0;
                do {
                  *(undefined4 *)((long)pvVar30 + lVar29 * 4) =
                       *(undefined4 *)((long)pvVar28 + lVar29 * 4);
                  lVar29 = lVar29 + 1;
                } while (uVar39 != (uint)lVar29);
              }
              uVar40 = uVar40 + 1;
              pvVar30 = (void *)((long)pvVar30 + lVar41 * 4);
              pvVar28 = (void *)((long)pvVar28 + sVar45 * sVar10);
            } while (uVar40 != uVar6);
          }
        }
      }
    }
  }
  return iVar36;
}

Assistant:

int Flatten_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}